

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChromaticitiesAttribute.cpp
# Opt level: O1

void __thiscall
Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::writeValueTo
          (TypedAttribute<Imf_3_4::Chromaticities> *this,OStream *os,int version)

{
  float local_1c;
  
  local_1c = (this->_value).red.x;
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  local_1c = (this->_value).red.y;
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  local_1c = (this->_value).green.x;
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  local_1c = (this->_value).green.y;
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  local_1c = (this->_value).blue.x;
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  local_1c = (this->_value).blue.y;
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  local_1c = (this->_value).white.x;
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  local_1c = (this->_value).white.y;
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  return;
}

Assistant:

IMF_EXPORT void
ChromaticitiesAttribute::writeValueTo (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os, int version) const
{
    Xdr::write<StreamIO> (os, _value.red.x);
    Xdr::write<StreamIO> (os, _value.red.y);
    Xdr::write<StreamIO> (os, _value.green.x);
    Xdr::write<StreamIO> (os, _value.green.y);
    Xdr::write<StreamIO> (os, _value.blue.x);
    Xdr::write<StreamIO> (os, _value.blue.y);
    Xdr::write<StreamIO> (os, _value.white.x);
    Xdr::write<StreamIO> (os, _value.white.y);
}